

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O1

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<6>::DynamicIntegerPointsKdTreeEncoder
          (DynamicIntegerPointsKdTreeEncoder<6> *this,uint32_t dimension)

{
  void *pvVar1;
  ulong __n;
  ulong __n_00;
  allocator_type local_76;
  allocator_type local_75;
  value_type_conflict5 local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  VectorUint32 *local_58;
  HalfEncoder *local_50;
  AxisEncoder *local_48;
  RemainingBitsEncoder *local_40;
  NumbersEncoder *local_38;
  
  this->bit_length_ = 0;
  this->dimension_ = dimension;
  FoldedBit32Encoder<draco::RAnsBitEncoder>::FoldedBit32Encoder(&this->numbers_encoder_);
  local_38 = &this->numbers_encoder_;
  DirectBitEncoder::DirectBitEncoder(&this->remaining_bits_encoder_);
  local_40 = &this->remaining_bits_encoder_;
  DirectBitEncoder::DirectBitEncoder(&this->axis_encoder_);
  local_50 = &this->half_encoder_;
  local_48 = &this->axis_encoder_;
  DirectBitEncoder::DirectBitEncoder(local_50);
  local_58 = &this->deviations_;
  __n = (ulong)dimension;
  local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (local_58,__n,(value_type_conflict5 *)&local_70,(allocator_type *)&local_74);
  local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->num_remaining_bits_,__n,(value_type_conflict5 *)&local_70,
             (allocator_type *)&local_74);
  local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->axes_,__n,(value_type_conflict5 *)&local_70,(allocator_type *)&local_74);
  local_74 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_70,__n,&local_74,&local_75);
  __n_00 = (ulong)(dimension * 0x20 + 1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->base_stack_,__n_00,&local_70,&local_76);
  pvVar1 = (void *)CONCAT44(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_70.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  local_74 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_70,__n,&local_74,&local_75);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->levels_stack_,__n_00,&local_70,&local_76);
  pvVar1 = (void *)CONCAT44(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_70.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  return;
}

Assistant:

explicit DynamicIntegerPointsKdTreeEncoder(uint32_t dimension)
      : bit_length_(0),
        dimension_(dimension),
        deviations_(dimension, 0),
        num_remaining_bits_(dimension, 0),
        axes_(dimension, 0),
        base_stack_(32 * dimension + 1, VectorUint32(dimension, 0)),
        levels_stack_(32 * dimension + 1, VectorUint32(dimension, 0)) {}